

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.nalg.c
# Opt level: O2

void pnga_zero(Integer g_a)

{
  int iVar1;
  int iVar2;
  Integer grp_id;
  Integer proc;
  Integer IVar3;
  logical lVar4;
  long lVar5;
  long lVar6;
  long icode;
  long lVar7;
  void *ptr;
  Integer elems;
  Integer type;
  Integer ndim;
  Integer _hi [7];
  Integer _lo [7];
  Integer _ld [6];
  Integer _dims [7];
  
  iVar2 = _ga_sync_end;
  iVar1 = _ga_sync_begin;
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  grp_id = pnga_get_pgroup(g_a);
  if (iVar1 != 0) {
    pnga_pgroup_sync(grp_id);
  }
  proc = pnga_pgroup_nodeid(grp_id);
  pnga_check_handle(g_a,"ga_zero");
  IVar3 = pnga_total_blocks(g_a);
  pnga_inquire(g_a,&type,&ndim,_dims);
  if (IVar3 < 0) {
    pnga_distribution(g_a,proc,_lo,_hi);
    if (0 < _lo[0]) {
      lVar4 = pnga_has_ghosts(g_a);
      if (lVar4 != 0) {
        pnga_zero_patch(g_a,_lo,_hi);
        return;
      }
      pnga_access_ptr(g_a,_lo,_hi,&ptr,_ld);
      lVar7 = (_hi[ndim + -1] - _lo[ndim + -1]) + 1;
      lVar5 = ndim;
      for (icode = 0; elems = lVar7, icode < lVar5 + -1; icode = icode + 1) {
        lVar6 = (_hi[icode] - _lo[icode]) + 1;
        if (_ld[icode] != lVar6) {
          pnga_error("layout problem",icode);
          lVar6 = (_hi[icode] - _lo[icode]) + 1;
          lVar5 = ndim;
        }
        lVar7 = lVar7 * lVar6;
      }
      memset(ptr,0,lVar7 * *(long *)(BYTE_ARRAY_001cd4a5 + type * 0x10 + 0x13));
      pnga_release_update(g_a,_lo,_hi);
    }
  }
  else {
    pnga_access_block_segment_ptr(g_a,proc,&ptr,&elems);
    memset(ptr,0,elems * *(long *)(BYTE_ARRAY_001cd4a5 + type * 0x10 + 0x13));
    pnga_release_update_block_segment(g_a,proc);
  }
  if (iVar2 != 0) {
    pnga_pgroup_sync(grp_id);
  }
  return;
}

Assistant:

void pnga_zero(Integer g_a)
{
  Integer ndim, type, me, elems, p_handle;
  Integer num_blocks;
  void *ptr;
  Integer _dims[MAXDIM];
  Integer _ld[MAXDIM-1];
  Integer _lo[MAXDIM];
  Integer _hi[MAXDIM];
  /*register Integer i;*/
  int local_sync_begin,local_sync_end;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  p_handle = pnga_get_pgroup(g_a);

  if(local_sync_begin) pnga_pgroup_sync(p_handle);

  me = pnga_pgroup_nodeid(p_handle);

  pnga_check_handle(g_a, "ga_zero");

  num_blocks = pnga_total_blocks(g_a);

  pnga_inquire(g_a, &type, &ndim, _dims);
  if (num_blocks < 0) {
    pnga_distribution(g_a, me, _lo, _hi);

    if ( _lo[0]> 0 ){ /* base index is 1: we get 0 if no elements stored on p */

      if (pnga_has_ghosts(g_a)) {
        pnga_zero_patch(g_a,_lo,_hi);
        return;
      }
      pnga_access_ptr(g_a, _lo, _hi, &ptr, _ld);
      GET_ELEMS(ndim,_lo,_hi,_ld,&elems);

      /* switch (type){ */
/*         int *ia; */
/*         double *da; */
/*         float *fa; */
/*         long *la; */
/*         long long *lla; */
/*         case C_INT: */
/*         ia = (int*)ptr; */
/*         for(i=0;i<elems;i++) ia[i]  = 0; */
/*         break; */
/*         case C_DCPL: */
/*         elems *=2; */
/*         case C_DBL: */
/*         da = (double*)ptr; */
/*         for(i=0;i<elems;i++) da[i] = 0; */
/*         break; */
/*         case C_SCPL: */
/*         elems *=2; */
/*         case C_FLOAT: */
/*         fa = (float*)ptr; */
/*         for(i=0;i<elems;i++) fa[i]  = 0; */
/*         break; */
/*         case C_LONG: */
/*         la = (long*)ptr; */
/*         for(i=0;i<elems;i++) la[i]  = 0; */
/*         break; */
/*         case C_LONGLONG: */
/*         lla = (long long*)ptr; */
/*         for(i=0;i<elems;i++) lla[i]  = 0; */
/*         break; */
/*         default: pnga_error(" wrong data type ",type); */
/*       } */
      memset(ptr, 0, GAsizeofM(type)*elems);

      /* release access to the data */
      pnga_release_update(g_a, _lo, _hi);
    } 
  } else {
    pnga_access_block_segment_ptr(g_a, me, &ptr, &elems);
/*     switch (type){ */
/*       int *ia; */
/*       double *da; */
/*       float *fa; */
/*       long *la; */
/*       long long *lla; */
/*       case C_INT: */
/*         ia = (int*)ptr; */
/*         for(i=0;i<elems;i++) ia[i]  = 0; */
/*         break; */
/*       case C_DCPL: */
/*         elems *=2; */
/*       case C_DBL: */
/*         da = (double*)ptr; */
/*         for(i=0;i<elems;i++) da[i] = 0; */
/*         break; */
/*       case C_SCPL: */
/*         elems *=2; */
/*       case C_FLOAT: */
/*         fa = (float*)ptr; */
/*         for(i=0;i<elems;i++) fa[i]  = 0; */
/*         break; */
/*       case C_LONG: */
/*       la = (long*)ptr; */
/*       for(i=0;i<elems;i++) la[i]  = 0; */
/*       break; */
/*       case C_LONGLONG: */
/*       lla = (long long*)ptr; */
/*       for(i=0;i<elems;i++) lla[i]  = 0; */
/*       break; */
/*       default: pnga_error(" wrong data type ",type); */
/*     } */
      memset(ptr, 0, GAsizeofM(type)*elems);

    /* release access to the data */
    pnga_release_update_block_segment(g_a, me);
  }
  if(local_sync_end)pnga_pgroup_sync(p_handle);
}